

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCacheRemove(Parse *pParse,int iReg,int nReg)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    iVar2 = *(int *)((long)&pParse->aColCache[0].iReg + lVar3);
    if (iVar2 < nReg + iReg && iReg <= iVar2) {
      if ((&pParse->aColCache[0].tempReg)[lVar3] != '\0') {
        bVar1 = pParse->nTempReg;
        if ((ulong)bVar1 < 8) {
          pParse->nTempReg = bVar1 + 1;
          pParse->aTempReg[bVar1] = iVar2;
        }
        (&pParse->aColCache[0].tempReg)[lVar3] = '\0';
      }
      *(undefined4 *)((long)&pParse->aColCache[0].iReg + lVar3) = 0;
    }
    lVar3 = lVar3 + 0x18;
  } while ((int)lVar3 != 0xf0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCacheRemove(Parse *pParse, int iReg, int nReg){
  int i;
  int iLast = iReg + nReg - 1;
  struct yColCache *p;
  for(i=0, p=pParse->aColCache; i<SQLITE_N_COLCACHE; i++, p++){
    int r = p->iReg;
    if( r>=iReg && r<=iLast ){
      cacheEntryClear(pParse, p);
      p->iReg = 0;
    }
  }
}